

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void colmajor_to_rowmajor<double,unsigned_long>
               (double *Xc,unsigned_long *Xc_ind,unsigned_long *Xc_indptr,size_t nrows,size_t ncols,
               vector<double,_std::allocator<double>_> *Xr,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_ind,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_indptr)

{
  size_type __n;
  ulong uVar1;
  pointer pdVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  unsigned_long uVar6;
  long lVar7;
  ulong uVar8;
  size_type sVar9;
  unsigned_long uVar10;
  size_t sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pair<unsigned_long_*,_long> pVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> row_indices;
  allocator_type local_81;
  unsigned_long *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<double,_std::allocator<double>_> *local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  double *local_40;
  size_t local_38;
  
  __n = Xc_indptr[ncols];
  local_60 = Xr;
  local_40 = Xc;
  local_38 = nrows;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_58,__n,(allocator_type *)&local_78);
  puVar3 = local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ncols != 0) {
    sVar11 = 0;
    do {
      uVar1 = Xc_indptr[sVar11];
      lVar7 = Xc_indptr[sVar11 + 1] - uVar1;
      if (uVar1 <= Xc_indptr[sVar11 + 1] && lVar7 != 0) {
        memcpy(puVar3 + uVar1,Xc_ind + uVar1,lVar7 * 8);
      }
      sVar11 = sVar11 + 1;
    } while (ncols != sVar11);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_78,__n,&local_81);
  sVar11 = local_38;
  puVar3 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar4 = _DAT_0036b1f0;
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar1 = ((long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start) - 8;
    auVar14._8_4_ = (int)uVar1;
    auVar14._0_8_ = uVar1;
    auVar14._12_4_ = (int)(uVar1 >> 0x20);
    auVar12._0_8_ = uVar1 >> 3;
    auVar12._8_8_ = auVar14._8_8_ >> 3;
    uVar8 = 0;
    auVar12 = auVar12 ^ _DAT_0036b1f0;
    auVar13 = _DAT_0036b1e0;
    do {
      auVar14 = auVar13 ^ auVar4;
      if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                  auVar12._4_4_ < auVar14._4_4_) & 1)) {
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = uVar8;
      }
      if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
          auVar14._12_4_ <= auVar12._12_4_) {
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8 + 1] = uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar7 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar7 + 2;
    } while (((uVar1 >> 3) + 2 & 0xfffffffffffffffe) != uVar8);
    if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar7 = (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      pVar15 = std::get_temporary_buffer<unsigned_long>((lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
      lVar7 = pVar15.second;
      local_80 = pVar15.first;
      if (local_80 == (unsigned_long *)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<colmajor_to_rowmajor<double,unsigned_long>(double_const*,unsigned_long_const*,unsigned_long_const*,unsigned_long,unsigned_long,std::vector<double,std::allocator<double>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )puVar3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_utils_hpp:3655:22)>
                    )&local_58);
        lVar7 = 0;
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<colmajor_to_rowmajor<double,unsigned_long>(double_const*,unsigned_long_const*,unsigned_long_const*,unsigned_long,unsigned_long,std::vector<double,std::allocator<double>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )puVar3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish,local_80,lVar7,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_utils_hpp:3655:22)>
                    )&local_58);
      }
      operator_delete(local_80,lVar7 << 3);
    }
  }
  std::vector<double,_std::allocator<double>_>::resize(local_60,__n);
  pdVar5 = local_40;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Xr_ind,__n);
  if (__n != 0) {
    pdVar2 = (local_60->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (Xr_ind->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = 0;
    do {
      uVar6 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar9];
      pdVar2[sVar9] = pdVar5[uVar6];
      puVar3[sVar9] = Xc_ind[uVar6];
      sVar9 = sVar9 + 1;
    } while (__n != sVar9);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Xr_indptr,sVar11 + 1);
  if (__n != 0) {
    puVar3 = (Xr_indptr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = 0;
    uVar10 = 0;
    uVar6 = 0;
    do {
      if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start
          [local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[sVar9]] == uVar6) {
        uVar10 = uVar10 + 1;
      }
      else {
        puVar3[uVar6 + 1] = uVar10;
        uVar6 = local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar9]];
        uVar10 = 0;
      }
      sVar9 = sVar9 + 1;
    } while (__n != sVar9);
  }
  if (1 < sVar11) {
    puVar3 = (Xr_indptr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = puVar3[1];
    lVar7 = 0;
    do {
      uVar6 = uVar6 + puVar3[lVar7 + 2];
      puVar3[lVar7 + 2] = uVar6;
      lVar7 = lVar7 + 1;
    } while (sVar11 - 1 != lVar7);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void colmajor_to_rowmajor(const real_t *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                          size_t nrows, size_t ncols,
                          std::vector<double> &Xr, std::vector<size_t> &Xr_ind, std::vector<size_t> &Xr_indptr)
{
    /* First convert to COO */
    size_t nnz = Xc_indptr[ncols];
    std::vector<size_t> row_indices(nnz);
    for (size_t col = 0; col < ncols; col++)
    {
        for (sparse_ix ix = Xc_indptr[col]; ix < Xc_indptr[col+1]; ix++)
        {
            row_indices[ix] = Xc_ind[ix];
        }
    }

    /* Then copy the data argsorted by rows */
    std::vector<size_t> argsorted_indices(nnz);
    std::iota(argsorted_indices.begin(), argsorted_indices.end(), (size_t)0);
    std::stable_sort(argsorted_indices.begin(), argsorted_indices.end(),
                     [&row_indices](const size_t a, const size_t b)
                     {return row_indices[a] < row_indices[b];});
    Xr.resize(nnz);
    Xr_ind.resize(nnz);
    for (size_t ix = 0; ix < nnz; ix++)
    {
        Xr[ix] = Xc[argsorted_indices[ix]];
        Xr_ind[ix] = Xc_ind[argsorted_indices[ix]];
    }

    /* Now build the index pointer */
    Xr_indptr.resize(nrows+1);
    size_t curr_row = 0;
    size_t curr_n = 0;
    for (size_t ix = 0; ix < nnz; ix++)
    {
        if (row_indices[argsorted_indices[ix]] != curr_row)
        {
            Xr_indptr[curr_row+1] = curr_n;
            curr_n = 0;
            curr_row = row_indices[argsorted_indices[ix]];
        }

        else
        {
            curr_n++;
        }
    }
    for (size_t row = 1; row < nrows; row++)
        Xr_indptr[row+1] += Xr_indptr[row];
}